

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3ColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  int iVar1;
  int iVar2;
  sqlite3_value *pValue;
  int iVar3;
  sqlite3_vtab *psVar4;
  bool bVar5;
  
  iVar3 = *(int *)&pCursor->pVtab[2].pModule;
  if (iCol - iVar3 == 2) {
    if (pCursor[3].pVtab != (sqlite3_vtab *)0x0) {
      psVar4 = (sqlite3_vtab *)(long)*(int *)&pCursor[4].pVtab;
      goto LAB_001adffe;
    }
    if (pCursor->pVtab[3].zErrMsg == (char *)0x0) {
      sqlite3_result_int(pCtx,0);
      return 0;
    }
  }
  else {
    if (iCol - iVar3 == 1) {
      psVar4 = pCursor[6].pVtab;
LAB_001adffe:
      sqlite3_result_int64(pCtx,(i64)psVar4);
      return 0;
    }
    bVar5 = iCol == iVar3;
    iVar3 = iCol;
    if (bVar5) {
      sqlite3_result_pointer(pCtx,pCursor,"fts3cursor",(_func_void_void_ptr *)0x0);
      return 0;
    }
  }
  iVar1 = fts3CursorSeek((sqlite3_context *)0x0,(Fts3Cursor *)pCursor);
  if (iVar1 == 0) {
    psVar4 = pCursor[2].pVtab;
    iVar2 = -1;
    if ((psVar4 != (sqlite3_vtab *)0x0) && (psVar4[6].zErrMsg != (char *)0x0)) {
      iVar2 = *(ushort *)&psVar4[8].pModule - 1;
    }
    iVar1 = 0;
    if (iVar3 < iVar2) {
      pValue = sqlite3_column_value((sqlite3_stmt *)psVar4,iVar3 + 1);
      sqlite3_result_value(pCtx,pValue);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int fts3ColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  int rc = SQLITE_OK;             /* Return Code */
  Fts3Cursor *pCsr = (Fts3Cursor *) pCursor;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;

  /* The column value supplied by SQLite must be in range. */
  assert( iCol>=0 && iCol<=p->nColumn+2 );

  switch( iCol-p->nColumn ){
    case 0:
      /* The special 'table-name' column */
      sqlite3_result_pointer(pCtx, pCsr, "fts3cursor", 0);
      break;

    case 1:
      /* The docid column */
      sqlite3_result_int64(pCtx, pCsr->iPrevId);
      break;

    case 2:
      if( pCsr->pExpr ){
        sqlite3_result_int64(pCtx, pCsr->iLangid);
        break;
      }else if( p->zLanguageid==0 ){
        sqlite3_result_int(pCtx, 0);
        break;
      }else{
        iCol = p->nColumn;
        /* no break */ deliberate_fall_through
      }

    default:
      /* A user column. Or, if this is a full-table scan, possibly the
      ** language-id column. Seek the cursor. */
      rc = fts3CursorSeek(0, pCsr);
      if( rc==SQLITE_OK && sqlite3_data_count(pCsr->pStmt)-1>iCol ){
        sqlite3_result_value(pCtx, sqlite3_column_value(pCsr->pStmt, iCol+1));
      }
      break;
  }

  assert( ((Fts3Table *)pCsr->base.pVtab)->pSegments==0 );
  return rc;
}